

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

CborError jsonValueToCbor(CborEncoder *parent,QJsonValue *v)

{
  qsizetype *pqVar1;
  int *piVar2;
  uint7 uVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  CborError extraout_EAX;
  char cVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  CborDevice *that_1;
  long lVar11;
  undefined1 *puVar12;
  CborDevice *pCVar13;
  undefined8 *puVar14;
  CborDevice *that_2;
  long in_FS_OFFSET;
  double __x;
  double dVar15;
  QArrayData *local_78;
  undefined8 local_70;
  undefined1 auStack_68 [16];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = QJsonValue::type();
  switch(uVar5) {
  default:
    if (parent->remaining != 0) {
      parent->remaining = parent->remaining - 1;
    }
    pCVar13 = (CborDevice *)parent->end;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar7 = 0xf6;
LAB_0010e7bf:
      CborDevice::putByte(pCVar13,bVar7);
      return extraout_EAX;
    }
    goto LAB_0010e976;
  case 1:
    bVar7 = QJsonValue::toBool(SUB81(v,0));
    if (parent->remaining != 0) {
      parent->remaining = parent->remaining - 1;
    }
    pCVar13 = (CborDevice *)parent->end;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar7 = bVar7 | 0xf4;
      goto LAB_0010e7bf;
    }
    goto LAB_0010e976;
  case 2:
    __x = (double)QJsonValue::toDouble(0.0);
    dVar15 = floor(__x);
    if (((__x != dVar15) || (NAN(__x) || NAN(dVar15))) || (9007199254740992.0 < ABS(__x))) {
      uVar3 = (uint7)((ulong)__x >> 8);
      local_58.d.d._1_7_ =
           (uint7)(byte)((ulong)__x >> 0x38) | (uVar3 & 0xff0000000000) >> 0x20 |
           (uVar3 & 0xff00000000) >> 0x10 | uVar3 & 0xff000000 |
           (uint7)(((ulong)__x & 0xff000000) << 8) | (uint7)(((ulong)__x & 0xff0000) << 0x18) |
           (uint7)(((ulong)__x & 0xff00) << 0x28);
      local_58.d.d._0_1_ = (QJsonArray)0xfb;
      local_58.d.ptr._0_1_ = SUB81(__x,0);
      if (parent->remaining != 0) {
        parent->remaining = parent->remaining - 1;
      }
      pCVar13 = (CborDevice *)parent->end;
      lVar11 = 0;
      do {
        CborDevice::putByte(pCVar13,*(uint8_t *)((long)&local_58.d.d + lVar11));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 9);
    }
    else {
      uVar9 = (ulong)__x;
      uVar10 = (long)uVar9 >> 0x3f ^ uVar9;
      if (parent->remaining != 0) {
        parent->remaining = parent->remaining - 1;
      }
      bVar7 = (byte)((long)uVar9 >> 0x3f) & 0x20;
      puVar12 = (undefined1 *)((long)&local_58.d.ptr + 7);
      local_58.d.d._0_1_ = (QJsonArray)0xaa;
      local_58.d.d._1_7_ = 0xaaaaaaaaaaaaaa;
      local_58.d.ptr._1_6_ =
           (uint6)((ushort)(uVar10 >> 0x30) & 0xff) | (uint6)((uint)(uVar10 >> 0x20) & 0xff00) |
           (uint6)(uVar10 >> 0x10) & 0xff0000 | (uint6)uVar10 & 0xff000000 |
           (uint6)(((uVar10 & 0xff0000) << 0x18) >> 8) | (uint6)(((uVar10 & 0xff00) << 0x28) >> 8);
      local_58.d.ptr._0_1_ = (undefined1)(uVar10 >> 0x38);
      local_58.d.ptr._7_1_ = (byte)uVar10;
      if (uVar10 < 0x18) {
        local_58.d.ptr._7_1_ = bVar7 | local_58.d.ptr._7_1_;
      }
      else {
        cVar6 = '\x02';
        if (uVar10 < 0x10000) {
          cVar6 = 0xff < uVar10;
        }
        bVar8 = (cVar6 + '\x01') - (uVar10 >> 0x20 == 0);
        lVar11 = -1L << (bVar8 & 0x3f);
        puVar12 = puVar12 + lVar11;
        *(byte *)((long)&local_58.d.ptr + lVar11 + 7) = bVar7 | bVar8 | 0x18;
      }
      pqVar1 = &local_58.d.size;
      if (pqVar1 != (qsizetype *)puVar12) {
        pCVar13 = (CborDevice *)parent->end;
        lVar11 = 0;
        do {
          CborDevice::putByte(pCVar13,puVar12[lVar11]);
          lVar11 = lVar11 + 1;
        } while ((long)pqVar1 - (long)puVar12 != lVar11);
      }
    }
    break;
  case 3:
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_1_ = (QJsonArray)0xaa;
    local_58.d.d._1_7_ = 0xaaaaaaaaaaaaaa;
    local_58.d.ptr._0_1_ = 0xaa;
    local_58.d.ptr._1_6_ = 0xaaaaaaaaaaaa;
    local_58.d.ptr._7_1_ = 0xaa;
    QJsonValue::toString();
    QString::toUtf8_helper(&local_58);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    qVar4 = local_58.d.size;
    puVar14 = (undefined8 *)
              CONCAT17(local_58.d.ptr._7_1_,CONCAT61(local_58.d.ptr._1_6_,local_58.d.ptr._0_1_));
    if (puVar14 == (undefined8 *)0x0) {
      puVar14 = &QByteArray::_empty;
    }
    if (parent->remaining != 0) {
      parent->remaining = parent->remaining - 1;
    }
    puVar12 = (undefined1 *)((long)&local_70 + 7);
    uVar9 = (ulong)local_58.d.size >> 0x38 | (local_58.d.size & 0xff000000000000U) >> 0x28 |
            (local_58.d.size & 0xff0000000000U) >> 0x18 | (local_58.d.size & 0xff00000000U) >> 8 |
            (local_58.d.size & 0xff000000U) << 8 | (local_58.d.size & 0xff0000U) << 0x18 |
            (local_58.d.size & 0xff00U) << 0x28;
    local_70 = uVar9 | local_58.d.size << 0x38;
    if ((ulong)local_58.d.size < (undefined1 *)0x18) {
      local_70._0_7_ = (undefined7)uVar9;
      local_70 = CONCAT17((char)local_58.d.size,(undefined7)local_70) | 0x6000000000000000;
    }
    else {
      cVar6 = '\x02';
      if ((ulong)local_58.d.size < (undefined1 *)0x10000) {
        cVar6 = (undefined1 *)0xff < (ulong)local_58.d.size;
      }
      bVar7 = (cVar6 + '\x01') - ((ulong)local_58.d.size >> 0x20 == 0);
      lVar11 = -1L << (bVar7 & 0x3f);
      puVar12 = puVar12 + lVar11;
      auStack_68[lVar11 + -1] = bVar7 | 0x78;
    }
    pCVar13 = (CborDevice *)parent->end;
    if (auStack_68 != puVar12) {
      lVar11 = 0;
      do {
        CborDevice::putByte(pCVar13,puVar12[lVar11]);
        lVar11 = lVar11 + 1;
      } while ((long)auStack_68 - (long)puVar12 != lVar11);
      pCVar13 = (CborDevice *)parent->end;
    }
    if ((undefined1 *)qVar4 != (undefined1 *)0x0) {
      puVar12 = (undefined1 *)0x0;
      do {
        CborDevice::putChar(pCVar13,*(char *)((long)puVar14 + (long)puVar12));
        puVar12 = puVar12 + 1;
      } while ((undefined1 *)qVar4 != puVar12);
    }
    piVar2 = (int *)CONCAT71(local_58.d.d._1_7_,local_58.d.d._0_1_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,local_58.d.d._0_1_),1,0x10)
        ;
      }
    }
    break;
  case 4:
    QJsonValue::toArray();
    jsonArrayToCbor(parent,(QJsonArray *)&local_58);
    QJsonArray::~QJsonArray((QJsonArray *)&local_58);
    break;
  case 5:
    QJsonValue::toObject();
    jsonObjectToCbor(parent,(QJsonObject *)&local_58);
    QJsonObject::~QJsonObject((QJsonObject *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (CborError)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_0010e976:
  __stack_chk_fail();
}

Assistant:

static CborError jsonValueToCbor(CborEncoder *parent, const QJsonValue &v)
{
    switch (v.type()) {
    case QJsonValue::Null:
    case QJsonValue::Undefined:
        return cbor_encode_null(parent);
    case QJsonValue::Bool:
        return cbor_encode_boolean(parent, v.toBool());
    case QJsonValue::Array:
        return jsonArrayToCbor(parent, v.toArray());
    case QJsonValue::Object:
        return jsonObjectToCbor(parent, v.toObject());
    case QJsonValue::String: {
        QByteArray s = v.toString().toUtf8();
        return cbor_encode_text_string(parent, s.constData(), s.size());
    }
    case QJsonValue::Double: {
        double d = v.toDouble();
        if (d == floor(d) && fabs(d) <= (Q_INT64_C(1) << std::numeric_limits<double>::digits))
            return cbor_encode_int(parent, qint64(d));
        return cbor_encode_double(parent, d);
    }
    }
    Q_UNREACHABLE_RETURN(CborUnknownError);
}